

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::lineEndingsToStr
          (LineContinuationTest *this,LINE_ENDINGS line_ending)

{
  char *pcVar1;
  
  pcVar1 = "dos";
  if (line_ending == UNIX) {
    pcVar1 = "unix";
  }
  return pcVar1;
}

Assistant:

const GLchar* LineContinuationTest::lineEndingsToStr(LINE_ENDINGS line_ending) const
{
	const GLchar* result = 0;

	if (UNIX == line_ending)
	{
		result = "unix";
	}
	else
	{
		result = "dos";
	}

	return result;
}